

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

mg_node * mg_node_alloc(uint32_t label_count,mg_allocator *allocator)

{
  mg_node *pmVar1;
  
  pmVar1 = (mg_node *)mg_allocator_malloc(allocator,(ulong)label_count * 8 + 0x20);
  if (pmVar1 != (mg_node *)0x0) {
    pmVar1->labels = (mg_string **)(pmVar1 + 1);
  }
  return pmVar1;
}

Assistant:

mg_node *mg_node_alloc(uint32_t label_count, mg_allocator *allocator) {
  size_t labels_size = label_count * sizeof(mg_string *);
  char *block = mg_allocator_malloc(allocator, sizeof(mg_node) + labels_size);
  if (!block) {
    return NULL;
  }
  mg_node *node = (mg_node *)block;
  node->labels = (mg_string **)(block + sizeof(mg_node));
  return node;
}